

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-filter-tokens.cc
# Opt level: O2

int main(int argc,char **argv)

{
  StringReverser *__p;
  ColorToGray *this;
  undefined8 extraout_RAX;
  long *plVar1;
  ostream *poVar2;
  char *pcVar3;
  int extraout_EDX;
  long lVar4;
  QPDF pdf;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88 [3];
  char *local_70;
  long local_68;
  long local_60;
  __shared_ptr<QPDFObjectHandle::TokenFilter,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<QPDFObjectHandle::TokenFilter,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if (argc == 3) {
    pcVar3 = argv[1];
    local_70 = argv[2];
    QPDF::QPDF(&pdf);
    QPDF::processFile((char *)&pdf,pcVar3);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w,&pdf);
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&w);
    for (lVar4 = local_68; lVar4 != local_60; lVar4 = lVar4 + 0x38) {
      __p = (StringReverser *)operator_new(0x10);
      *(undefined ***)__p = &PTR__TokenFilter_00107c10;
      std::__shared_ptr<QPDFObjectHandle::TokenFilter,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<StringReverser,void>(local_40,__p);
      QPDFPageObjectHelper::addContentTokenFilter(lVar4,local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
      this = (ColorToGray *)operator_new(0xb0);
      ColorToGray::ColorToGray(this);
      std::__shared_ptr<QPDFObjectHandle::TokenFilter,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<ColorToGray,void>(local_50,this);
      QPDFPageObjectHelper::addContentTokenFilter(lVar4,local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_68);
    QPDFWriter::QPDFWriter(&w,&pdf,local_70);
    QPDFWriter::setStaticID(SUB81(&w,0));
    QPDFWriter::setQDFMode(SUB81(&w,0));
    QPDFWriter::write();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_88);
    QPDF::~QPDF(&pdf);
    return 0;
  }
  usage();
  QPDF::~QPDF(&pdf);
  if (extraout_EDX == 1) {
    plVar1 = (long *)__cxa_begin_catch(extraout_RAX);
    poVar2 = std::operator<<((ostream *)&std::cerr,whoami);
    poVar2 = std::operator<<(poVar2,": ");
    pcVar3 = (char *)(**(code **)(*plVar1 + 0x10))(plVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    exit(2);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    if (argc != 3) {
        usage();
    }
    char const* infilename = argv[1];
    char const* outfilename = argv[2];

    try {
        QPDF pdf;
        pdf.processFile(infilename);
        for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
            // Attach two token filters to each page of this file. When the file is written, or when
            // the pages' contents are retrieved in any other way, the filters will be applied. See
            // comments on the filters for additional details.
            page.addContentTokenFilter(
                std::shared_ptr<QPDFObjectHandle::TokenFilter>(new StringReverser));
            page.addContentTokenFilter(
                std::shared_ptr<QPDFObjectHandle::TokenFilter>(new ColorToGray));
        }

        QPDFWriter w(pdf, outfilename);
        w.setStaticID(true); // for testing only
        w.setQDFMode(true);
        w.write();
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}